

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ReturnStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ReturnStatementSyntax,slang::syntax::ReturnStatementSyntax_const&>
          (BumpAllocator *this,ReturnStatementSyntax *args)

{
  ReturnStatementSyntax *this_00;
  
  this_00 = (ReturnStatementSyntax *)allocate(this,0x80,8);
  syntax::ReturnStatementSyntax::ReturnStatementSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }